

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int get_mvpred_var_cost(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv,
                       FULLPEL_MV_STATS *mv_stats)

{
  undefined4 uVar1;
  long lVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int *in_RDX;
  FULLPEL_MV *in_RSI;
  long in_RDI;
  int bestsme;
  int ref_stride;
  int src_stride;
  uint8_t *src_buf;
  buf_2d *ref;
  buf_2d *src;
  MV sub_this_mv;
  aom_variance_fn_ptr_t *vfp;
  FULLPEL_MV *mv;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar7;
  
  lVar2 = *(long *)(in_RDI + 8);
  get_mv_from_fullmv(in_RSI);
  mv = (FULLPEL_MV *)**(undefined8 **)(in_RDI + 0x18);
  uVar7 = *(undefined4 *)(*(undefined8 **)(in_RDI + 0x18) + 3);
  uVar1 = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18);
  pcVar3 = *(code **)(lVar2 + 0x18);
  puVar6 = get_buf_from_fullmv((buf_2d *)CONCAT44(uVar7,in_stack_ffffffffffffffa0),mv);
  iVar4 = (*pcVar3)(mv,uVar7,puVar6,uVar1,in_RDX + 2);
  in_RDX[1] = iVar4;
  iVar5 = mv_err_cost_((MV *)mv,(MV_COST_PARAMS *)0x26c803);
  *in_RDX = iVar5;
  return *in_RDX + iVar4;
}

Assistant:

static inline int get_mvpred_var_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv,
    FULLPEL_MV_STATS *mv_stats) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const MV sub_this_mv = get_mv_from_fullmv(this_mv);
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  int bestsme;

  bestsme = vfp->vf(src_buf, src_stride, get_buf_from_fullmv(ref, this_mv),
                    ref_stride, &mv_stats->sse);
  mv_stats->distortion = bestsme;

  mv_stats->err_cost = mv_err_cost_(&sub_this_mv, &ms_params->mv_cost_params);
  bestsme += mv_stats->err_cost;

  return bestsme;
}